

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

FxExpression * __thiscall FxWhileLoop::DoResolve(FxWhileLoop *this,FCompileContext *ctx)

{
  BYTE BVar1;
  FxExpression *pFVar2;
  PString *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FxBoolCast *this_00;
  FxExpression *pFVar5;
  FScriptPosition *other;
  bool bVar6;
  FString local_30;
  
  if ((this->super_FxLoopStatement).super_FxExpression.isresolved != false) {
    return (FxExpression *)this;
  }
  (this->super_FxLoopStatement).super_FxExpression.isresolved = true;
  if (this->Condition != (FxExpression *)0x0) {
    iVar4 = (*this->Condition->_vptr_FxExpression[2])();
    pFVar5 = (FxExpression *)CONCAT44(extraout_var,iVar4);
    this->Condition = pFVar5;
    if (pFVar5 != (FxExpression *)0x0) {
      pFVar2 = this->Code;
      if (pFVar2 != (FxExpression *)0x0) {
        iVar4 = (*pFVar2->_vptr_FxExpression[2])(pFVar2,ctx);
        this->Code = (FxExpression *)CONCAT44(extraout_var_00,iVar4);
        if ((FxExpression *)CONCAT44(extraout_var_00,iVar4) == (FxExpression *)0x0)
        goto LAB_005378c6;
        pFVar5 = this->Condition;
      }
      if (pFVar5->ValueType != (PType *)TypeBool) {
        this_00 = (FxBoolCast *)FMemArena::Alloc(&FxAlloc,0x38);
        pFVar5 = this->Condition;
        (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370
        ;
        FScriptPosition::FScriptPosition
                  (&(this_00->super_FxExpression).ScriptPosition,&pFVar5->ScriptPosition);
        (this_00->super_FxExpression).isresolved = false;
        (this_00->super_FxExpression).NeedResult = true;
        (this_00->super_FxExpression).ExprType = EFX_BoolCast;
        (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxBoolCast_0070b548;
        this_00->basex = pFVar5;
        (this_00->super_FxExpression).ValueType = (PType *)TypeBool;
        this_00->NeedValue = true;
        this->Condition = (FxExpression *)this_00;
        pFVar5 = FxBoolCast::Resolve(this_00,ctx);
        this->Condition = pFVar5;
        if (pFVar5 == (FxExpression *)0x0) goto LAB_005378c6;
      }
      iVar4 = (*pFVar5->_vptr_FxExpression[3])(pFVar5);
      if ((char)iVar4 == '\0') {
        return (FxExpression *)this;
      }
      pPVar3 = (PString *)this->Condition[1]._vptr_FxExpression;
      other = &this->Condition[1].ScriptPosition;
      if (pPVar3 == TypeString) {
        FString::AttachToOther(&local_30,&other->FileName);
      }
      else {
        local_30.Chars = (other->FileName).Chars;
      }
      BVar1 = (pPVar3->super_PBasicType).super_PType.RegType;
      if (BVar1 == '\x01') {
        bVar6 = (double)local_30.Chars != 0.0;
      }
      else if (BVar1 == '\0') {
        bVar6 = (int)local_30.Chars != 0;
      }
      else {
        bVar6 = false;
      }
      if (pPVar3 == TypeString) {
        FString::~FString(&local_30);
      }
      if (bVar6) {
        if (this->Code != (FxExpression *)0x0) {
          return (FxExpression *)this;
        }
        FScriptPosition::Message
                  (&(this->super_FxLoopStatement).super_FxExpression.ScriptPosition,0,
                   "Infinite empty loop");
        return (FxExpression *)this;
      }
      pFVar5 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x28);
      pFVar5->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070d370;
      FScriptPosition::FScriptPosition
                (&pFVar5->ScriptPosition,
                 &(this->super_FxLoopStatement).super_FxExpression.ScriptPosition);
      pFVar5->ValueType = (PType *)0x0;
      pFVar5->ExprType = EFX_Nop;
      pFVar5->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_0070de78;
      pFVar5->isresolved = true;
      pFVar5->NeedResult = true;
      (*(this->super_FxLoopStatement).super_FxExpression._vptr_FxExpression[1])(this);
      return pFVar5;
    }
  }
LAB_005378c6:
  (*(this->super_FxLoopStatement).super_FxExpression._vptr_FxExpression[1])(this);
  return (FxExpression *)0x0;
}

Assistant:

FxExpression *FxWhileLoop::DoResolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Condition, ctx);
	SAFE_RESOLVE_OPT(Code, ctx);

	if (Condition->ValueType != TypeBool)
	{
		Condition = new FxBoolCast(Condition);
		SAFE_RESOLVE(Condition, ctx);
	}

	if (Condition->isConstant())
	{
		if (static_cast<FxConstant *>(Condition)->GetValue().GetBool() == false)
		{ // Nothing happens
			FxExpression *nop = new FxNop(ScriptPosition);
			delete this;
			return nop;
		}
		else if (Code == nullptr)
		{ // "while (true) { }"
		  // Someone could be using this for testing.
			ScriptPosition.Message(MSG_WARNING, "Infinite empty loop");
		}
	}

	return this;
}